

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddRPathCheckRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *this_00;
  cmComputeLinkInformation *this_01;
  ostream *poVar3;
  WrapQuotes wrapQuotes;
  string_view str;
  string local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [8];
  string escapedNewRpath;
  undefined1 local_98 [8];
  string newRpath;
  cmComputeLinkInformation *cli;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *toDestDirPath_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  wrapQuotes = (WrapQuotes)toDestDirPath;
  if ((((this->ImportLibrary & 1U) == 0) && (this->NamelinkMode != NamelinkModeOnly)) &&
     (local_30 = toDestDirPath, toDestDirPath_local = config, config_local = (string *)os,
     os_local = (ostream *)this, this_local._4_4_ = indent.Level,
     bVar1 = cmGeneratorTarget::IsChrpathUsed(this->Target,config), bVar1)) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_51);
    bVar1 = cmMakefile::IsOn(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if ((!bVar1) &&
       (this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,toDestDirPath_local),
       this_01 != (cmComputeLinkInformation *)0x0)) {
      newRpath.field_2._12_4_ = this_local._4_4_;
      poVar3 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
      poVar3 = std::operator<<(poVar3,"file(RPATH_CHECK\n");
      newRpath.field_2._8_4_ = this_local._4_4_;
      poVar3 = ::operator<<(poVar3,(cmScriptGeneratorIndent)this_local._4_4_);
      poVar3 = std::operator<<(poVar3,"     FILE \"");
      poVar3 = std::operator<<(poVar3,(string *)local_30);
      std::operator<<(poVar3,"\"\n");
      PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0095(this->Target);
      if ((PVar2 == OLD) || (PVar2 == WARN)) {
        cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)local_98,this_01);
        escapedNewRpath.field_2._12_4_ = this_local._4_4_;
        poVar3 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
        poVar3 = std::operator<<(poVar3,"     RPATH \"");
        poVar3 = std::operator<<(poVar3,(string *)local_98);
        std::operator<<(poVar3,"\")\n");
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        cmComputeLinkInformation::GetChrpathString_abi_cxx11_(&local_f0,this_01);
        local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
        str._M_len = local_d0._8_8_;
        str._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)local_c0,local_d0._0_8_,str,wrapQuotes);
        std::__cxx11::string::~string((string *)&local_f0);
        poVar3 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
        poVar3 = std::operator<<(poVar3,"     RPATH ");
        poVar3 = std::operator<<(poVar3,(string *)local_c0);
        std::operator<<(poVar3,")\n");
        std::__cxx11::string::~string((string *)local_c0);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddRPathCheckRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || this->NamelinkMode == NamelinkModeOnly ||
      !this->Target->IsChrpathUsed(config)) {
    return;
  }
  // Skip if on Apple
  if (this->Target->Target->GetMakefile()->IsOn(
        "CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  // Write a rule to remove the installed file if its rpath is not the
  // new rpath.  This is needed for existing build/install trees when
  // the installed rpath changes but the file is not rebuilt.
  os << indent << "file(RPATH_CHECK\n"
     << indent << "     FILE \"" << toDestDirPath << "\"\n";

  // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
  // CMake install script.
  switch (this->Target->GetPolicyStatusCMP0095()) {
    case cmPolicies::WARN:
      // No author warning needed here, we warn later in
      // cmInstallTargetGenerator::AddChrpathPatchRule().
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      // Get the install RPATH from the link information.
      std::string newRpath = cli->GetChrpathString();
      os << indent << "     RPATH \"" << newRpath << "\")\n";
      break;
    }
    default: {
      // Get the install RPATH from the link information and
      // escape any CMake syntax in the install RPATH.
      std::string escapedNewRpath =
        cmOutputConverter::EscapeForCMake(cli->GetChrpathString());
      os << indent << "     RPATH " << escapedNewRpath << ")\n";
      break;
    }
  }
}